

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O1

void __thiscall
shared_data::print_update
          (shared_data *this,bool holdout_set_off,size_t current_pass,string *label,
          string *prediction,size_t num_features,bool progress_add,float progress_arg)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ostream *poVar7;
  float fVar8;
  
  lVar4 = *(long *)(std::cerr + -0x18);
  uVar5 = *(undefined8 *)(fwrite + lVar4);
  uVar6 = *(undefined8 *)(boost::program_options::detail::cmdline::style + lVar4);
  uVar3 = *(uint *)(close + lVar4);
  if (current_pass != 0 && !holdout_set_off) {
    dVar1 = this->holdout_sum_loss;
    dVar2 = this->weighted_holdout_examples;
    *(undefined8 *)(boost::program_options::detail::cmdline::style + lVar4) = 8;
    lVar4 = *(long *)(std::cerr + -0x18);
    if ((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar2 != 0.0)) || (NAN(dVar2))) {
      *(undefined8 *)(fwrite + lVar4) = 6;
      *(uint *)(close + *(long *)(std::cerr + -0x18)) =
           *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xfffffefb | 4;
      *(uint *)(close + *(long *)(std::cerr + -0x18)) =
           *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xffffff4f | 0x80;
      std::ostream::_M_insert<double>(this->holdout_sum_loss / this->weighted_holdout_examples);
    }
    else {
      *(uint *)(close + lVar4) = *(uint *)(close + lVar4) & 0xffffff4f | 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," unknown",8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
    dVar1 = this->weighted_holdout_examples_since_last_dump;
    dVar2 = this->holdout_sum_loss_since_last_dump;
    *(undefined8 *)(boost::program_options::detail::cmdline::style + *(long *)(std::cerr + -0x18)) =
         8;
    lVar4 = *(long *)(std::cerr + -0x18);
    if (((dVar2 != 0.0) || (NAN(dVar2))) || ((dVar1 != 0.0 || (NAN(dVar1))))) {
      *(undefined8 *)(fwrite + lVar4) = 6;
      *(uint *)(close + *(long *)(std::cerr + -0x18)) =
           *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xfffffefb | 4;
      *(uint *)(close + *(long *)(std::cerr + -0x18)) =
           *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xffffff4f | 0x80;
      std::ostream::_M_insert<double>
                (this->holdout_sum_loss_since_last_dump /
                 this->weighted_holdout_examples_since_last_dump);
    }
    else {
      *(uint *)(close + lVar4) = *(uint *)(close + lVar4) & 0xffffff4f | 0x20;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," unknown",8);
    }
    this->weighted_holdout_examples_since_last_dump = 0.0;
    this->holdout_sum_loss_since_last_dump = 0.0;
  }
  else {
    *(undefined8 *)(boost::program_options::detail::cmdline::style + lVar4) = 8;
    *(undefined8 *)(fwrite + *(long *)(std::cerr + -0x18)) = 6;
    *(uint *)(close + *(long *)(std::cerr + -0x18)) =
         *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xffffff4f | 0x80;
    *(uint *)(close + *(long *)(std::cerr + -0x18)) =
         *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xfffffefb | 4;
    if (this->weighted_labeled_examples <= 0.0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"n.a.",4);
    }
    else {
      std::ostream::_M_insert<double>(this->sum_loss / this->weighted_labeled_examples);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
    *(undefined8 *)(boost::program_options::detail::cmdline::style + *(long *)(std::cerr + -0x18)) =
         8;
    *(undefined8 *)(fwrite + *(long *)(std::cerr + -0x18)) = 6;
    *(uint *)(close + *(long *)(std::cerr + -0x18)) =
         *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xffffff4f | 0x80;
    *(uint *)(close + *(long *)(std::cerr + -0x18)) =
         *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xfffffefb | 4;
    dVar1 = this->weighted_labeled_examples;
    dVar2 = this->old_weighted_labeled_examples;
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      std::ostream::_M_insert<double>(this->sum_loss_since_last_dump / (dVar1 - dVar2));
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"n.a.",4);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
  *(undefined8 *)(boost::program_options::detail::cmdline::style + *(long *)(std::cerr + -0x18)) =
       0xc;
  *(uint *)(close + *(long *)(std::cerr + -0x18)) =
       *(uint *)(close + *(long *)(std::cerr + -0x18)) & 0xffffff4f | 0x80;
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 0xe;
  *(undefined8 *)(&poVar7->field_0x8 + (long)poVar7->_vptr_basic_ostream[-3]) = 1;
  *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
  poVar7 = std::ostream::_M_insert<double>
                     (this->weighted_labeled_examples + this->weighted_unlabeled_examples);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 8;
  *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(label->_M_dataplus)._M_p,label->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 8;
  *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(prediction->_M_dataplus)._M_p,prediction->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 8;
  *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffff4f | 0x80;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  if (current_pass != 0 && !holdout_set_off) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," h",2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::ostream::flush();
  *(undefined8 *)(boost::program_options::detail::cmdline::style + *(long *)(std::cerr + -0x18)) =
       uVar6;
  *(undefined8 *)(fwrite + *(long *)(std::cerr + -0x18)) = uVar5;
  *(uint *)(close + *(long *)(std::cerr + -0x18)) =
       *(uint *)(close + *(long *)(std::cerr + -0x18)) | uVar3;
  this->sum_loss_since_last_dump = 0.0;
  this->old_weighted_labeled_examples = this->weighted_labeled_examples;
  fVar8 = (float)(this->weighted_labeled_examples + this->weighted_unlabeled_examples);
  if (progress_add) {
    fVar8 = fVar8 + progress_arg;
  }
  else {
    fVar8 = fVar8 * progress_arg;
  }
  this->dump_interval = fVar8;
  return;
}

Assistant:

void print_update(bool holdout_set_off, size_t current_pass, const std::string& label, const std::string& prediction,
      size_t num_features, bool progress_add, float progress_arg)
  {
    std::streamsize saved_w = std::cerr.width();
    std::streamsize saved_prec = std::cerr.precision();
    std::ostream::fmtflags saved_f = std::cerr.flags();
    bool holding_out = false;

    if (!holdout_set_off && current_pass >= 1)
    {
      if (holdout_sum_loss == 0. && weighted_holdout_examples == 0.)
        std::cerr << std::setw(col_avg_loss) << std::left << " unknown";
      else
        std::cerr << std::setw(col_avg_loss) << std::setprecision(prec_avg_loss) << std::fixed << std::right
                  << (holdout_sum_loss / weighted_holdout_examples);

      std::cerr << " ";

      if (holdout_sum_loss_since_last_dump == 0. && weighted_holdout_examples_since_last_dump == 0.)
        std::cerr << std::setw(col_since_last) << std::left << " unknown";
      else
        std::cerr << std::setw(col_since_last) << std::setprecision(prec_since_last) << std::fixed << std::right
                  << (holdout_sum_loss_since_last_dump / weighted_holdout_examples_since_last_dump);

      weighted_holdout_examples_since_last_dump = 0;
      holdout_sum_loss_since_last_dump = 0.0;

      holding_out = true;
    }
    else
    {
      std::cerr << std::setw(col_avg_loss) << std::setprecision(prec_avg_loss) << std::right << std::fixed;
      if (weighted_labeled_examples > 0.)
        std::cerr << (sum_loss / weighted_labeled_examples);
      else
        std::cerr << "n.a.";
      std::cerr << " " << std::setw(col_since_last) << std::setprecision(prec_avg_loss) << std::right << std::fixed;
      if (weighted_labeled_examples == old_weighted_labeled_examples)
        std::cerr << "n.a.";
      else
        std::cerr << (sum_loss_since_last_dump / (weighted_labeled_examples - old_weighted_labeled_examples));
    }
    std::cerr << " " << std::setw(col_example_counter) << std::right << example_number << " "
              << std::setw(col_example_weight) << std::setprecision(prec_example_weight) << std::right
              << weighted_examples() << " " << std::setw(col_current_label) << std::right << label << " "
              << std::setw(col_current_predict) << std::right << prediction << " " << std::setw(col_current_features)
              << std::right << num_features;

    if (holding_out)
      std::cerr << " h";

    std::cerr << std::endl;
    std::cerr.flush();

    std::cerr.width(saved_w);
    std::cerr.precision(saved_prec);
    std::cerr.setf(saved_f);

    update_dump_interval(progress_add, progress_arg);
  }